

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O0

void configDir(char **dir,uint *dirLength,char *application,uint applicationLength)

{
  uchar uVar1;
  uint local_44;
  uint configPrefixLen;
  uint homeLen;
  char *home;
  char *pcStack_30;
  uint configPathLen;
  char *configPath;
  char *pcStack_20;
  uint applicationLength_local;
  char *application_local;
  uint *dirLength_local;
  char **dir_local;
  
  configPath._4_4_ = applicationLength;
  pcStack_20 = application;
  application_local = (char *)dirLength;
  dirLength_local = (uint *)dir;
  uVar1 = checkStringOutParameter(dir,dirLength);
  if (uVar1 != '\0') {
    getEnv("HOME",4,(char **)&configPrefixLen,&local_44);
    home._4_4_ = local_44 + 9 + configPath._4_4_;
    pcStack_30 = (char *)malloc((ulong)home._4_4_);
    memcpy(pcStack_30,_configPrefixLen,(ulong)local_44);
    builtin_strncpy(pcStack_30 + local_44,"/.config/",9);
    free(_configPrefixLen);
    memcpy(pcStack_30 + (home._4_4_ - configPath._4_4_),pcStack_20,(ulong)configPath._4_4_);
    copyToStringOutParameter
              (pcStack_30,home._4_4_,(char **)dirLength_local,(uint *)application_local);
    free(pcStack_30);
  }
  return;
}

Assistant:

void configDir(char ** dir, unsigned int * dirLength, const char * application, unsigned int applicationLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(dir, dirLength))
    {
        return;
    }

    char * configPath;
    unsigned int configPathLen;

    #if defined SYSTEM_WINDOWS
        char * appData;
        unsigned int appDataLen;
        getEnv("APPDATA", 7, &appData, &appDataLen);

        configPathLen = appDataLen + 1 + applicationLength;
        configPath = (char *)malloc(sizeof(char) * configPathLen);
        memcpy(configPath, appData, appDataLen);
        configPath[appDataLen] = '\\';

        free(appData);
    #elif defined SYSTEM_DARWIN
        char * home;
        unsigned int homeLen;
        getEnv("HOME", 4, &home, &homeLen);

        configPathLen = homeLen + 21 + applicationLength;
        configPath = (char *)malloc(sizeof(char) * configPathLen);
        memcpy(configPath, home, homeLen);
        memcpy(configPath + homeLen, "/Library/Preferences/", 21);

        free(home);
    #else
        char * home;
        unsigned int homeLen;
        getEnv("HOME", 4, &home, &homeLen);

        configPathLen = homeLen + 9 + applicationLength;
        configPath = (char *)malloc(sizeof(char) * configPathLen);
        memcpy(configPath, home, homeLen);
        memcpy(configPath + homeLen, "/.config/", 9);

        free(home);
    #endif

    unsigned int configPrefixLen = configPathLen - applicationLength;
    memcpy(configPath + configPrefixLen, application, applicationLength);
    copyToStringOutParameter(configPath, configPathLen, dir, dirLength);

    free(configPath);
}